

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialvalue.cpp
# Opt level: O0

void __thiscall
ConfidentialValue_GetCommitment_Test::TestBody(ConfidentialValue_GetCommitment_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_130;
  Message local_128;
  string local_120;
  undefined1 local_100 [8];
  AssertionResult gtest_ar;
  ConfidentialValue commitment;
  Amount amount;
  string local_b0;
  undefined1 local_90 [8];
  BlindFactor vbf;
  allocator local_59;
  string local_58;
  undefined1 local_38 [8];
  ConfidentialAssetId asset_commitment;
  ConfidentialValue_GetCommitment_Test *this_local;
  
  asset_commitment._32_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_58,
             "0a533b742a568c0b5285bf5bdfe9623a78082d19fac9be1678f7c3adbb48b34d29",&local_59);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId((ConfidentialAssetId *)local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_b0,"fe3357df1f35df75412d9ad86ebd99e622e26019722f316027787a685e2cd71a",
             (allocator *)&amount.field_0xf);
  cfd::core::BlindFactor::BlindFactor((BlindFactor *)local_90,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&amount.field_0xf);
  cfd::core::Amount::Amount((Amount *)&commitment.version_,13000000000000);
  cfd::core::ConfidentialValue::GetCommitment
            ((ConfidentialValue *)&gtest_ar.message_,(Amount *)&commitment.version_,
             (ConfidentialAssetId *)local_38,(BlindFactor *)local_90);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_
            (&local_120,(ConfidentialValue *)&gtest_ar.message_);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_100,"commitment.GetHex().c_str()",
             "\"08672d4e2e60f2e8d742552a8bc4ca6335ed214982c7728b4483284169aaae7f49\"",pcVar2,
             "08672d4e2e60f2e8d742552a8bc4ca6335ed214982c7728b4483284169aaae7f49");
  std::__cxx11::string::~string((string *)&local_120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar1) {
    testing::Message::Message(&local_128);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialvalue.cpp"
               ,0xaa,pcVar2);
    testing::internal::AssertHelper::operator=(&local_130,&local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    testing::Message::~Message(&local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&gtest_ar.message_);
  cfd::core::BlindFactor::~BlindFactor((BlindFactor *)local_90);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)local_38);
  return;
}

Assistant:

TEST(ConfidentialValue, GetCommitment) {
  ConfidentialAssetId asset_commitment(
      "0a533b742a568c0b5285bf5bdfe9623a78082d19fac9be1678f7c3adbb48b34d29");
  BlindFactor vbf(
      "fe3357df1f35df75412d9ad86ebd99e622e26019722f316027787a685e2cd71a");
  Amount amount(int64_t{13000000000000});
  ConfidentialValue commitment = ConfidentialValue::GetCommitment(
      amount, asset_commitment, vbf);
  EXPECT_STREQ(
      commitment.GetHex().c_str(),
      "08672d4e2e60f2e8d742552a8bc4ca6335ed214982c7728b4483284169aaae7f49");
}